

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectFieldsEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  _Base_ptr p_Var2;
  HeapThunk *pHVar3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_node_base *p_Var5;
  allocator_type *in_RCX;
  _Rb_tree_node_base *args_2;
  _Link_type __x;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar6;
  Value VVar7;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  fields;
  HeapThunk *th;
  undefined1 local_b0 [32];
  _Rb_tree_node_base *local_90;
  size_t local_88;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_80;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"objectFieldsEx","");
  local_68 = (undefined1  [8])0x100000012;
  __l._M_len = 2;
  __l._M_array = (iterator)local_68;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_80,__l,in_RCX);
  params = &local_80;
  validateBuiltinArgs(this,loc,(string *)local_b0,args,params);
  if (local_80.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  args_2 = (_Rb_tree_node_base *)(local_b0 + 8);
  local_b0._8_4_ = _S_red;
  local_b0._16_8_ = 0;
  local_88 = 0;
  local_b0._24_8_ = args_2;
  local_90 = args_2;
  objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_68,(Interpreter *)(pVVar1->v).h,(HeapObject *)(ulong)(pVVar1[1].v.b ^ 1),
               SUB81(args_2,0));
  if (_Stack_60._M_left != &_Stack_60) {
    p_Var2 = _Stack_60._M_left;
    do {
      std::
      _Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
      ::_M_insert_unique<std::__cxx11::u32string_const&>
                ((_Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
                  *)local_b0,
                 *(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> **)
                  (p_Var2 + 1));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != &_Stack_60);
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)local_68);
  local_68 = (undefined1  [8])0x0;
  _Stack_60._0_8_ = (pointer)0x0;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  VVar6 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          *)local_68);
  (this->scratch).t = ARRAY;
  (this->scratch).v.h = VVar6._0_8_;
  if ((_Rb_tree_node_base *)local_b0._24_8_ != (_Rb_tree_node_base *)(local_b0 + 8)) {
    p_Var5 = (_Rb_tree_node_base *)local_b0._24_8_;
    do {
      pHVar3 = (anonymous_namespace)::Interpreter::
               makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                         ((Interpreter *)this,(Identifier **)this->idArrayElement,(void **)0x0,
                          (int *)args_2,(void **)params);
      local_68 = (undefined1  [8])pHVar3;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)(VVar6._0_8_ + 1),(value_type *)local_68);
      __x = *(_Link_type *)(p_Var5 + 1);
      VVar7 = makeString(this,(UString *)__x);
      (pHVar3->content).t = STRING;
      (pHVar3->content).v = VVar7._0_8_;
      (pHVar3->super_HeapEntity).field_0xa = 1;
      pHVar3->self = (HeapObject *)0x0;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)(pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      p_Var4 = &(pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)(local_b0 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               *)local_b0);
  return (AST *)0x0;
}

Assistant:

const AST *builtinObjectFieldsEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "objectFieldsEx", args, {Value::OBJECT, Value::BOOLEAN});
        const auto *obj = static_cast<HeapObject *>(args[0].v.h);
        bool include_hidden = args[1].v.b;
        // Stash in a set first to sort them.
        std::set<UString> fields;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            fields.insert(field->name);
        }
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        for (const auto &field : fields) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
            elements.push_back(th);
            th->fill(makeString(field));
        }
        return nullptr;
    }